

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O3

uint8_t GmmIsReconstructableSurface(GMM_RESOURCE_FORMAT Format)

{
  uint8_t uVar1;
  
  uVar1 = '\x01';
  if ((((0x1b < Format - GMM_FORMAT_NV12) ||
       ((0x86e003dU >> (Format - GMM_FORMAT_NV12 & 0x1f) & 1) == 0)) &&
      (Format != GMM_FORMAT_YCRCB_NORMAL)) && (Format != GMM_FORMAT_AYUV)) {
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

uint8_t GMM_STDCALL GmmIsReconstructableSurface(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_AYUV:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_Y210:
        case GMM_FORMAT_Y216:
        case GMM_FORMAT_Y212:
        case GMM_FORMAT_Y410:
        case GMM_FORMAT_Y416:
        case GMM_FORMAT_P8:
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_YUY2_2x1:
        case GMM_FORMAT_YUY2:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }
    return Status;
}